

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShaderImageLoadStoreTests.cpp
# Opt level: O0

ostream * gl4cts::anon_unknown_0::operator<<(ostream *stream,imageUniformDeclaration *declaration)

{
  ostream *poVar1;
  undefined1 local_40 [8];
  imageFormatDetails format_details;
  imageUniformDeclaration *declaration_local;
  ostream *stream_local;
  
  format_details.m_verification_routine = (verificationRoutine)declaration;
  ImageLoadStoreMultipleUniformsTest::getImageUniformDeclarationDetails
            (declaration->m_index,(imageFormatDetails *)local_40);
  poVar1 = std::operator<<(stream,"layout(");
  poVar1 = std::operator<<(poVar1,(char *)local_40);
  poVar1 = std::operator<<(poVar1,") uniform ");
  poVar1 = std::operator<<(poVar1,format_details.m_image_format);
  std::operator<<(poVar1," ");
  ImageLoadStoreMultipleUniformsTest::writeImageUniformNameToStream
            (stream,*(GLuint *)format_details.m_verification_routine);
  std::operator<<(stream,";");
  return stream;
}

Assistant:

std::ostream& operator<<(std::ostream& stream, const imageUniformDeclaration& declaration)
	{
		ImageLoadStoreMultipleUniformsTest::imageFormatDetails format_details;
		getImageUniformDeclarationDetails(declaration.m_index, format_details);

		/* layout(r32f) uniform image2D u_image_0; */
		stream << "layout(" << format_details.m_image_format << ") uniform " << format_details.m_image_type << " ";

		ImageLoadStoreMultipleUniformsTest::writeImageUniformNameToStream(stream, declaration.m_index);

		stream << ";";

		return stream;
	}